

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O3

ostream * amrex::operator<<(ostream *os,DistributionMapping *pmap)

{
  element_type *peVar1;
  pointer piVar2;
  pointer piVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  long lVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(os,"(DistributionMapping",0x14);
  uStack_38._0_6_ = CONCAT15(10,(undefined5)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 5),1);
  peVar1 = (pmap->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  piVar2 = *(pointer *)
            ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
  piVar3 = *(pointer *)
            &(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl;
  if (piVar2 != piVar3 && -1 < (long)piVar2 - (long)piVar3) {
    lVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"m_pmap[",7);
      poVar4 = (ostream *)std::ostream::operator<<(os,(int)lVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,*(int *)(*(long *)&(((pmap->m_ref).
                                                                                                            
                                                  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->m_pmap).
                                                  super_vector<int,_std::allocator<int>_>.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + lVar5 * 4));
      uStack_38._0_5_ = CONCAT14(10,(undefined4)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 4),1);
      lVar5 = lVar5 + 1;
      peVar1 = (pmap->m_ref).
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    } while (lVar5 < (long)*(pointer *)
                            ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                     *(long *)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2);
  }
  uStack_38._0_7_ = CONCAT16(0x29,(undefined6)uStack_38);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 6),1);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 7),1);
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("operator<<(ostream &, DistributionMapping &) failed");
  }
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream&              os,
            const DistributionMapping& pmap)
{
    os << "(DistributionMapping" << '\n';

    for (int i = 0; i < pmap.ProcessorMap().size(); ++i)
    {
        os << "m_pmap[" << i << "] = " << pmap.ProcessorMap()[i] << '\n';
    }

    os << ')' << '\n';

    if (os.fail())
        amrex::Error("operator<<(ostream &, DistributionMapping &) failed");

    return os;
}